

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

Am_Constraint * __thiscall
Web_Constraint::Create(Web_Constraint *this,Am_Slot *param_1,Am_Slot *new_slot)

{
  bool bVar1;
  Am_Web_Data *this_00;
  Am_Slot *new_slot_local;
  Am_Slot *param_1_local;
  Web_Constraint *this_local;
  
  if ((this->owner->create_proc == (Am_Web_Create_Proc *)0x0) ||
     (bVar1 = (*this->owner->create_proc)(new_slot), !bVar1)) {
    this_local = (Web_Constraint *)0x0;
  }
  else {
    this_00 = (Am_Web_Data *)operator_new(0x70);
    Am_Web_Data::Am_Web_Data(this_00,this->owner);
    this_local = (Web_Constraint *)Am_Web_Data::operator_cast_to_Am_Constraint_(this_00);
  }
  return &this_local->super_Am_Constraint;
}

Assistant:

Am_Constraint *
Web_Constraint::Create(const Am_Slot &, const Am_Slot &new_slot)
{
  if (owner->create_proc && owner->create_proc(new_slot))
    return *(new Am_Web_Data(owner));
  return nullptr;
}